

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.cc
# Opt level: O3

void brotli::BuildMetaBlockGreedyWithContexts
               (uint8_t *ringbuffer,size_t pos,size_t mask,uint8_t prev_byte,uint8_t prev_byte2,
               ContextType literal_context_mode,size_t num_contexts,uint32_t *static_context_map,
               Command *commands,size_t n_commands,MetaBlockSplit *mb)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  Command *pCVar5;
  size_t sVar6;
  pointer puVar7;
  long lVar8;
  size_t sVar9;
  ulong uVar10;
  ContextBlockSplitter<brotli::Histogram<256>_> lit_blocks;
  BlockSplitter<brotli::Histogram<520>_> dist_blocks;
  BlockSplitter<brotli::Histogram<704>_> cmd_blocks;
  ContextBlockSplitter<brotli::Histogram<256>_> local_198;
  BlockSplitter<brotli::Histogram<520>_> local_110;
  BlockSplitter<brotli::Histogram<704>_> local_a0;
  
  sVar9 = 0;
  pCVar5 = commands;
  sVar6 = n_commands;
  if (n_commands != 0) {
    do {
      sVar9 = sVar9 + pCVar5->insert_len_;
      sVar6 = sVar6 - 1;
      pCVar5 = pCVar5 + 1;
    } while (sVar6 != 0);
  }
  ContextBlockSplitter<brotli::Histogram<256>_>::ContextBlockSplitter
            (&local_198,0x100,num_contexts,0x200,400.0,sVar9,&mb->literal_split,
             &mb->literal_histograms);
  BlockSplitter<brotli::Histogram<704>_>::BlockSplitter
            (&local_a0,0x2c0,0x400,500.0,n_commands,&mb->command_split,&mb->command_histograms);
  BlockSplitter<brotli::Histogram<520>_>::BlockSplitter
            (&local_110,0x40,0x200,100.0,n_commands,&mb->distance_split,&mb->distance_histograms);
  if (n_commands != 0) {
    sVar6 = 0;
    do {
      uVar3 = commands[sVar6].insert_len_;
      uVar4 = commands[sVar6].copy_len_;
      uVar1 = commands[sVar6].dist_prefix_;
      uVar2 = commands[sVar6].cmd_prefix_;
      BlockSplitter<brotli::Histogram<704>_>::AddSymbol(&local_a0,(ulong)uVar2);
      for (uVar10 = (ulong)uVar3; uVar10 != 0; uVar10 = uVar10 - 1) {
        if (literal_context_mode < 4) {
          (*(code *)(&DAT_001ee520 + *(int *)(&DAT_001ee520 + (ulong)literal_context_mode * 4)))();
          return;
        }
        ContextBlockSplitter<brotli::Histogram<256>_>::AddSymbol
                  (&local_198,(ulong)ringbuffer[pos & mask],(ulong)*static_context_map);
        pos = pos + 1;
      }
      pos = pos + uVar4;
      if (((ulong)uVar4 != 0) && (0x7f < uVar2)) {
        BlockSplitter<brotli::Histogram<520>_>::AddSymbol(&local_110,(ulong)uVar1);
      }
      sVar6 = sVar6 + 1;
    } while (sVar6 != n_commands);
  }
  ContextBlockSplitter<brotli::Histogram<256>_>::FinishBlock(&local_198,true);
  BlockSplitter<brotli::Histogram<704>_>::FinishBlock(&local_a0,true);
  BlockSplitter<brotli::Histogram<520>_>::FinishBlock(&local_110,true);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&mb->literal_context_map,(mb->literal_split).num_types << 6);
  sVar6 = (mb->literal_split).num_types;
  if (sVar6 != 0) {
    puVar7 = (mb->literal_context_map).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar9 = 0;
    do {
      lVar8 = 0;
      do {
        puVar7[lVar8] = static_context_map[lVar8] + (int)sVar9 * (int)num_contexts;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x40);
      sVar9 = sVar9 + 1;
      puVar7 = puVar7 + 0x40;
    } while (sVar9 != sVar6);
  }
  if (local_198.last_entropy_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.last_entropy_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_198.last_entropy_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.last_entropy_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void BuildMetaBlockGreedyWithContexts(const uint8_t* ringbuffer,
                                      size_t pos,
                                      size_t mask,
                                      uint8_t prev_byte,
                                      uint8_t prev_byte2,
                                      ContextType literal_context_mode,
                                      size_t num_contexts,
                                      const uint32_t* static_context_map,
                                      const Command *commands,
                                      size_t n_commands,
                                      MetaBlockSplit* mb) {
  size_t num_literals = 0;
  for (size_t i = 0; i < n_commands; ++i) {
    num_literals += commands[i].insert_len_;
  }

  ContextBlockSplitter<HistogramLiteral> lit_blocks(
      256, num_contexts, 512, 400.0, num_literals,
      &mb->literal_split, &mb->literal_histograms);
  BlockSplitter<HistogramCommand> cmd_blocks(
      kNumCommandPrefixes, 1024, 500.0, n_commands,
      &mb->command_split, &mb->command_histograms);
  BlockSplitter<HistogramDistance> dist_blocks(
      64, 512, 100.0, n_commands,
      &mb->distance_split, &mb->distance_histograms);

  for (size_t i = 0; i < n_commands; ++i) {
    const Command cmd = commands[i];
    cmd_blocks.AddSymbol(cmd.cmd_prefix_);
    for (size_t j = cmd.insert_len_; j != 0; --j) {
      size_t context = Context(prev_byte, prev_byte2, literal_context_mode);
      uint8_t literal = ringbuffer[pos & mask];
      lit_blocks.AddSymbol(literal, static_context_map[context]);
      prev_byte2 = prev_byte;
      prev_byte = literal;
      ++pos;
    }
    pos += cmd.copy_len_;
    if (cmd.copy_len_ > 0) {
      prev_byte2 = ringbuffer[(pos - 2) & mask];
      prev_byte = ringbuffer[(pos - 1) & mask];
      if (cmd.cmd_prefix_ >= 128) {
        dist_blocks.AddSymbol(cmd.dist_prefix_);
      }
    }
  }

  lit_blocks.FinishBlock(/* is_final = */ true);
  cmd_blocks.FinishBlock(/* is_final = */ true);
  dist_blocks.FinishBlock(/* is_final = */ true);

  mb->literal_context_map.resize(
      mb->literal_split.num_types << kLiteralContextBits);
  for (size_t i = 0; i < mb->literal_split.num_types; ++i) {
    for (size_t j = 0; j < (1u << kLiteralContextBits); ++j) {
      mb->literal_context_map[(i << kLiteralContextBits) + j] =
          static_cast<uint32_t>(i * num_contexts) + static_context_map[j];
    }
  }
}